

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

string * __thiscall
deqp::gls::DrawTestSpec::getMultilineDesc_abi_cxx11_
          (string *__return_storage_ptr__,DrawTestSpec *this)

{
  AttributeSpec *pAVar1;
  AttributeSpec *pAVar2;
  ostream *poVar3;
  InputType type;
  OutputType type_00;
  Storage storage;
  InputType type_01;
  OutputType type_02;
  IndexType type_03;
  Storage storage_00;
  IndexType type_04;
  Storage storage_01;
  IndexType type_05;
  Storage storage_02;
  IndexType type_06;
  Storage storage_03;
  IndexType type_07;
  Storage storage_04;
  IndexType type_08;
  Storage storage_05;
  IndexType type_09;
  Storage storage_06;
  char *pcVar4;
  byte local_4c1;
  byte local_459;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  const_reference local_1b0;
  AttributeSpec *attrib;
  size_t ndx;
  stringstream desc;
  ostream local_190;
  DrawTestSpec *local_18;
  DrawTestSpec *this_local;
  
  local_18 = this;
  this_local = (DrawTestSpec *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&ndx);
  for (attrib = (AttributeSpec *)0x0; pAVar1 = attrib,
      pAVar2 = (AttributeSpec *)
               std::
               vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
               ::size(&this->attribs), pAVar1 < pAVar2;
      attrib = (AttributeSpec *)((long)&attrib->inputType + 1)) {
    local_1b0 = std::
                vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                ::operator[](&this->attribs,(size_type)attrib);
    if ((local_1b0->useDefaultAttribute & 1U) == 0) {
      poVar3 = std::operator<<(&local_190,"Attribute ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ulong)attrib);
      poVar3 = std::operator<<(poVar3,": ");
      local_4c1 = 1;
      if (attrib != (AttributeSpec *)0x0) {
        local_4c1 = local_1b0->additionalPositionAttribute;
      }
      pcVar4 = "color\n";
      if ((local_4c1 & 1) != 0) {
        pcVar4 = "position\n";
      }
      poVar3 = std::operator<<(poVar3,pcVar4);
      poVar3 = std::operator<<(poVar3,"\tStorage in ");
      storageToString_abi_cxx11_(&local_220,(DrawTestSpec *)(ulong)local_1b0->storage,storage);
      poVar3 = std::operator<<(poVar3,(string *)&local_220);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"\tstride ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1b0->stride);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"\tinput datatype ");
      inputTypeToString_abi_cxx11_(&local_240,(DrawTestSpec *)(ulong)local_1b0->inputType,type_01);
      poVar3 = std::operator<<(poVar3,(string *)&local_240);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"\tinput component count ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1b0->componentCount);
      poVar3 = std::operator<<(poVar3,"\n");
      pcVar4 = "";
      if ((local_1b0->normalize & 1U) != 0) {
        pcVar4 = "\tnormalized\n";
      }
      poVar3 = std::operator<<(poVar3,pcVar4);
      poVar3 = std::operator<<(poVar3,"\tused as ");
      outputTypeToString_abi_cxx11_(&local_260,(DrawTestSpec *)(ulong)local_1b0->outputType,type_02)
      ;
      poVar3 = std::operator<<(poVar3,(string *)&local_260);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"\tinstance divisor ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1b0->instanceDivisor);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_220);
    }
    else {
      poVar3 = std::operator<<(&local_190,"Attribute ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ulong)attrib);
      poVar3 = std::operator<<(poVar3,": default, ");
      local_459 = 1;
      if (attrib != (AttributeSpec *)0x0) {
        local_459 = local_1b0->additionalPositionAttribute;
      }
      pcVar4 = "color\n";
      if ((local_459 & 1) != 0) {
        pcVar4 = "position\n";
      }
      poVar3 = std::operator<<(poVar3,pcVar4);
      poVar3 = std::operator<<(poVar3,"\tinput datatype ");
      inputTypeToString_abi_cxx11_(&local_1e0,(DrawTestSpec *)(ulong)local_1b0->inputType,type);
      poVar3 = std::operator<<(poVar3,(string *)&local_1e0);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"\tinput component count ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1b0->componentCount);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"\tused as ");
      outputTypeToString_abi_cxx11_(&local_200,(DrawTestSpec *)(ulong)local_1b0->outputType,type_00)
      ;
      poVar3 = std::operator<<(poVar3,(string *)&local_200);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_1e0);
    }
  }
  if (this->drawMethod == DRAWMETHOD_DRAWARRAYS) {
    poVar3 = std::operator<<(&local_190,"drawArrays()\n");
    poVar3 = std::operator<<(poVar3,"\tfirst ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->first);
    std::operator<<(poVar3,"\n");
  }
  else if (this->drawMethod == DRAWMETHOD_DRAWARRAYS_INSTANCED) {
    poVar3 = std::operator<<(&local_190,"drawArraysInstanced()\n");
    poVar3 = std::operator<<(poVar3,"\tfirst ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->first);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tinstance count ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->instanceCount);
    std::operator<<(poVar3,"\n");
  }
  else if (this->drawMethod == DRAWMETHOD_DRAWELEMENTS) {
    poVar3 = std::operator<<(&local_190,"drawElements()\n");
    poVar3 = std::operator<<(poVar3,"\tindex type ");
    indexTypeToString_abi_cxx11_(&local_280,(DrawTestSpec *)(ulong)this->indexType,type_03);
    poVar3 = std::operator<<(poVar3,(string *)&local_280);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindex storage in ");
    storageToString_abi_cxx11_(&local_2a0,(DrawTestSpec *)(ulong)this->indexStorage,storage_00);
    poVar3 = std::operator<<(poVar3,(string *)&local_2a0);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindex offset ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_280);
  }
  else if (this->drawMethod == DRAWMETHOD_DRAWELEMENTS_RANGED) {
    poVar3 = std::operator<<(&local_190,"drawElementsRanged()\n");
    poVar3 = std::operator<<(poVar3,"\tindex type ");
    indexTypeToString_abi_cxx11_(&local_2c0,(DrawTestSpec *)(ulong)this->indexType,type_04);
    poVar3 = std::operator<<(poVar3,(string *)&local_2c0);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindex storage in ");
    storageToString_abi_cxx11_(&local_2e0,(DrawTestSpec *)(ulong)this->indexStorage,storage_01);
    poVar3 = std::operator<<(poVar3,(string *)&local_2e0);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindex offset ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\trange start ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexMin);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\trange end ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexMax);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2c0);
  }
  else if (this->drawMethod == DRAWMETHOD_DRAWELEMENTS_INSTANCED) {
    poVar3 = std::operator<<(&local_190,"drawElementsInstanced()\n");
    poVar3 = std::operator<<(poVar3,"\tindex type ");
    indexTypeToString_abi_cxx11_(&local_300,(DrawTestSpec *)(ulong)this->indexType,type_05);
    poVar3 = std::operator<<(poVar3,(string *)&local_300);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindex storage in ");
    storageToString_abi_cxx11_(&local_320,(DrawTestSpec *)(ulong)this->indexStorage,storage_02);
    poVar3 = std::operator<<(poVar3,(string *)&local_320);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindex offset ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tinstance count ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->instanceCount);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_300);
  }
  else if (this->drawMethod == DRAWMETHOD_DRAWARRAYS_INDIRECT) {
    poVar3 = std::operator<<(&local_190,"drawArraysIndirect()\n");
    poVar3 = std::operator<<(poVar3,"\tfirst ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->first);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tinstance count ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->instanceCount);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindirect offset ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indirectOffset);
    std::operator<<(poVar3,"\n");
  }
  else if (this->drawMethod == DRAWMETHOD_DRAWELEMENTS_INDIRECT) {
    poVar3 = std::operator<<(&local_190,"drawElementsIndirect()\n");
    poVar3 = std::operator<<(poVar3,"\tindex type ");
    indexTypeToString_abi_cxx11_(&local_340,(DrawTestSpec *)(ulong)this->indexType,type_06);
    poVar3 = std::operator<<(poVar3,(string *)&local_340);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindex storage in ");
    storageToString_abi_cxx11_(&local_360,(DrawTestSpec *)(ulong)this->indexStorage,storage_03);
    poVar3 = std::operator<<(poVar3,(string *)&local_360);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindex offset ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tinstance count ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->instanceCount);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindirect offset ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indirectOffset);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tbase vertex ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->baseVertex);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_340);
  }
  else if (this->drawMethod == DRAWMETHOD_DRAWELEMENTS_BASEVERTEX) {
    poVar3 = std::operator<<(&local_190,"drawElementsBaseVertex()\n");
    poVar3 = std::operator<<(poVar3,"\tindex type ");
    indexTypeToString_abi_cxx11_(&local_380,(DrawTestSpec *)(ulong)this->indexType,type_07);
    poVar3 = std::operator<<(poVar3,(string *)&local_380);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindex storage in ");
    storageToString_abi_cxx11_(&local_3a0,(DrawTestSpec *)(ulong)this->indexStorage,storage_04);
    poVar3 = std::operator<<(poVar3,(string *)&local_3a0);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindex offset ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tbase vertex ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->baseVertex);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_380);
  }
  else if (this->drawMethod == DRAWMETHOD_DRAWELEMENTS_INSTANCED_BASEVERTEX) {
    poVar3 = std::operator<<(&local_190,"drawElementsInstancedBaseVertex()\n");
    poVar3 = std::operator<<(poVar3,"\tindex type ");
    indexTypeToString_abi_cxx11_(&local_3c0,(DrawTestSpec *)(ulong)this->indexType,type_08);
    poVar3 = std::operator<<(poVar3,(string *)&local_3c0);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindex storage in ");
    storageToString_abi_cxx11_(&local_3e0,(DrawTestSpec *)(ulong)this->indexStorage,storage_05);
    poVar3 = std::operator<<(poVar3,(string *)&local_3e0);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindex offset ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tinstance count ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->instanceCount);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tbase vertex ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->baseVertex);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_3c0);
  }
  else if (this->drawMethod == DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX) {
    poVar3 = std::operator<<(&local_190,"drawRangeElementsBaseVertex()\n");
    poVar3 = std::operator<<(poVar3,"\tindex type ");
    indexTypeToString_abi_cxx11_(&local_400,(DrawTestSpec *)(ulong)this->indexType,type_09);
    poVar3 = std::operator<<(poVar3,(string *)&local_400);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindex storage in ");
    storageToString_abi_cxx11_(&local_420,(DrawTestSpec *)(ulong)this->indexStorage,storage_06);
    poVar3 = std::operator<<(poVar3,(string *)&local_420);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindex offset ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tbase vertex ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->baseVertex);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\trange start ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexMin);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\trange end ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexMax);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::string::~string((string *)&local_400);
  }
  poVar3 = std::operator<<(&local_190,"\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->primitiveCount);
  std::operator<<(poVar3," ");
  switch(this->primitive) {
  case PRIMITIVE_POINTS:
    std::operator<<(&local_190,"points");
    break;
  case PRIMITIVE_TRIANGLES:
    std::operator<<(&local_190,"triangles");
    break;
  case PRIMITIVE_TRIANGLE_FAN:
    std::operator<<(&local_190,"triangles (fan)");
    break;
  case PRIMITIVE_TRIANGLE_STRIP:
    std::operator<<(&local_190,"triangles (strip)");
    break;
  case PRIMITIVE_LINES:
    std::operator<<(&local_190,"lines");
    break;
  case PRIMITIVE_LINE_STRIP:
    std::operator<<(&local_190,"lines (strip)");
    break;
  case PRIMITIVE_LINE_LOOP:
    std::operator<<(&local_190,"lines (loop)");
    break;
  case PRIMITIVE_LINES_ADJACENCY:
    std::operator<<(&local_190,"lines (adjancency)");
    break;
  case PRIMITIVE_LINE_STRIP_ADJACENCY:
    std::operator<<(&local_190,"lines (strip, adjancency)");
    break;
  case PRIMITIVE_TRIANGLES_ADJACENCY:
    std::operator<<(&local_190,"triangles (adjancency)");
    break;
  case PRIMITIVE_TRIANGLE_STRIP_ADJACENCY:
    std::operator<<(&local_190,"triangles (strip, adjancency)");
  }
  std::operator<<(&local_190,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ndx);
  return __return_storage_ptr__;
}

Assistant:

std::string DrawTestSpec::getMultilineDesc (void) const
{
	std::stringstream desc;

	for (size_t ndx = 0; ndx < attribs.size(); ++ndx)
	{
		const AttributeSpec& attrib = attribs[ndx];

		if (attrib.useDefaultAttribute)
		{
			desc
				<< "Attribute " << ndx << ": default, " << ((ndx == 0|| attrib.additionalPositionAttribute) ? ("position\n") : ("color\n"))
				<< "\tinput datatype " << DrawTestSpec::inputTypeToString((DrawTestSpec::InputType)attrib.inputType) << "\n"
				<< "\tinput component count " << attrib.componentCount << "\n"
				<< "\tused as " << DrawTestSpec::outputTypeToString(attrib.outputType) << "\n";
		}
		else
		{
			desc
				<< "Attribute " << ndx << ": " << ((ndx == 0|| attrib.additionalPositionAttribute) ? ("position\n") : ("color\n"))
				<< "\tStorage in " << DrawTestSpec::storageToString(attrib.storage) << "\n"
				<< "\tstride " << attrib.stride << "\n"
				<< "\tinput datatype " << DrawTestSpec::inputTypeToString((DrawTestSpec::InputType)attrib.inputType) << "\n"
				<< "\tinput component count " << attrib.componentCount << "\n"
				<< (attrib.normalize ? "\tnormalized\n" : "")
				<< "\tused as " << DrawTestSpec::outputTypeToString(attrib.outputType) << "\n"
				<< "\tinstance divisor " << attrib.instanceDivisor << "\n";
		}
	}

	if (drawMethod == DRAWMETHOD_DRAWARRAYS)
	{
		desc
			<< "drawArrays()\n"
			<< "\tfirst " << first << "\n";
	}
	else if (drawMethod == DRAWMETHOD_DRAWARRAYS_INSTANCED)
	{
		desc
			<< "drawArraysInstanced()\n"
			<< "\tfirst " << first << "\n"
			<< "\tinstance count " << instanceCount << "\n";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS)
	{
		desc
			<< "drawElements()\n"
			<< "\tindex type " << DrawTestSpec::indexTypeToString(indexType) << "\n"
			<< "\tindex storage in " << DrawTestSpec::storageToString(indexStorage) << "\n"
			<< "\tindex offset " << indexPointerOffset << "\n";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS_RANGED)
	{
		desc
			<< "drawElementsRanged()\n"
			<< "\tindex type " << DrawTestSpec::indexTypeToString(indexType) << "\n"
			<< "\tindex storage in " << DrawTestSpec::storageToString(indexStorage) << "\n"
			<< "\tindex offset " << indexPointerOffset << "\n"
			<< "\trange start " << indexMin << "\n"
			<< "\trange end " << indexMax << "\n";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS_INSTANCED)
	{
		desc
			<< "drawElementsInstanced()\n"
			<< "\tindex type " << DrawTestSpec::indexTypeToString(indexType) << "\n"
			<< "\tindex storage in " << DrawTestSpec::storageToString(indexStorage) << "\n"
			<< "\tindex offset " << indexPointerOffset << "\n"
			<< "\tinstance count " << instanceCount << "\n";
	}
	else if (drawMethod == DRAWMETHOD_DRAWARRAYS_INDIRECT)
	{
		desc
			<< "drawArraysIndirect()\n"
			<< "\tfirst " << first << "\n"
			<< "\tinstance count " << instanceCount << "\n"
			<< "\tindirect offset " << indirectOffset << "\n";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS_INDIRECT)
	{
		desc
			<< "drawElementsIndirect()\n"
			<< "\tindex type " << DrawTestSpec::indexTypeToString(indexType) << "\n"
			<< "\tindex storage in " << DrawTestSpec::storageToString(indexStorage) << "\n"
			<< "\tindex offset " << indexPointerOffset << "\n"
			<< "\tinstance count " << instanceCount << "\n"
			<< "\tindirect offset " << indirectOffset << "\n"
			<< "\tbase vertex " << baseVertex << "\n";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS_BASEVERTEX)
	{
		desc
			<< "drawElementsBaseVertex()\n"
			<< "\tindex type " << DrawTestSpec::indexTypeToString(indexType) << "\n"
			<< "\tindex storage in " << DrawTestSpec::storageToString(indexStorage) << "\n"
			<< "\tindex offset " << indexPointerOffset << "\n"
			<< "\tbase vertex " << baseVertex << "\n";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS_INSTANCED_BASEVERTEX)
	{
		desc
			<< "drawElementsInstancedBaseVertex()\n"
			<< "\tindex type " << DrawTestSpec::indexTypeToString(indexType) << "\n"
			<< "\tindex storage in " << DrawTestSpec::storageToString(indexStorage) << "\n"
			<< "\tindex offset " << indexPointerOffset << "\n"
			<< "\tinstance count " << instanceCount << "\n"
			<< "\tbase vertex " << baseVertex << "\n";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX)
	{
		desc
			<< "drawRangeElementsBaseVertex()\n"
			<< "\tindex type " << DrawTestSpec::indexTypeToString(indexType) << "\n"
			<< "\tindex storage in " << DrawTestSpec::storageToString(indexStorage) << "\n"
			<< "\tindex offset " << indexPointerOffset << "\n"
			<< "\tbase vertex " << baseVertex << "\n"
			<< "\trange start " << indexMin << "\n"
			<< "\trange end " << indexMax << "\n";
	}
	else
		DE_ASSERT(DE_FALSE);

	desc << "\t" << primitiveCount << " ";

	switch (primitive)
	{
		case DrawTestSpec::PRIMITIVE_POINTS:
			desc << "points";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLES:
			desc << "triangles";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLE_FAN:
			desc << "triangles (fan)";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP:
			desc << "triangles (strip)";
			break;
		case DrawTestSpec::PRIMITIVE_LINES:
			desc << "lines";
			break;
		case DrawTestSpec::PRIMITIVE_LINE_STRIP:
			desc << "lines (strip)";
			break;
		case DrawTestSpec::PRIMITIVE_LINE_LOOP:
			desc << "lines (loop)";
			break;
		case DrawTestSpec::PRIMITIVE_LINES_ADJACENCY:
			desc << "lines (adjancency)";
			break;
		case DrawTestSpec::PRIMITIVE_LINE_STRIP_ADJACENCY:
			desc << "lines (strip, adjancency)";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLES_ADJACENCY:
			desc << "triangles (adjancency)";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP_ADJACENCY:
			desc << "triangles (strip, adjancency)";
			break;
		default:
			DE_ASSERT(false);
			break;
	}

	desc << "\n";

	return desc.str();
}